

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O3

void Test_TemplateModifiers_AddModifier::Run(void)

{
  char cVar1;
  long lVar2;
  undefined8 extraout_RAX;
  NullModifier foo_modifier;
  code *local_10;
  
  cVar1 = ctemplate::AddModifier("x-atest",(TemplateModifier *)&ctemplate::html_escape);
  if (cVar1 == '\0') {
    Run();
LAB_00114e09:
    Run();
LAB_00114e0e:
    Run();
LAB_00114e13:
    Run();
LAB_00114e18:
    Run();
LAB_00114e1d:
    Run();
LAB_00114e22:
    Run();
LAB_00114e27:
    Run();
LAB_00114e2c:
    Run();
LAB_00114e31:
    Run();
LAB_00114e36:
    Run();
LAB_00114e3b:
    Run();
LAB_00114e40:
    Run();
LAB_00114e45:
    Run();
LAB_00114e4a:
    Run();
LAB_00114e4f:
    Run();
LAB_00114e54:
    Run();
  }
  else {
    cVar1 = ctemplate::AddModifier("x-atest-arg=",(TemplateModifier *)&ctemplate::html_escape);
    if (cVar1 == '\0') goto LAB_00114e09;
    cVar1 = ctemplate::AddModifier("x-atest-arg=h",(TemplateModifier *)&ctemplate::html_escape);
    if (cVar1 == '\0') goto LAB_00114e0e;
    cVar1 = ctemplate::AddModifier("x-atest-arg=html",(TemplateModifier *)&ctemplate::html_escape);
    if (cVar1 == '\0') goto LAB_00114e13;
    cVar1 = ctemplate::AddModifier("x-atest-arg=json",(TemplateModifier *)&ctemplate::json_escape);
    if (cVar1 == '\0') goto LAB_00114e18;
    cVar1 = ctemplate::AddModifier("x-atest-arg=j",(TemplateModifier *)&ctemplate::json_escape);
    if (cVar1 == '\0') goto LAB_00114e1d;
    cVar1 = ctemplate::AddModifier("x-atest-arg=J",(TemplateModifier *)&ctemplate::json_escape);
    if (cVar1 == '\0') goto LAB_00114e22;
    cVar1 = ctemplate::AddModifier("test",(TemplateModifier *)&ctemplate::html_escape);
    if (cVar1 != '\0') goto LAB_00114e27;
    cVar1 = ctemplate::AddModifier("x-atest",(TemplateModifier *)&ctemplate::html_escape);
    if (cVar1 != '\0') goto LAB_00114e2c;
    cVar1 = ctemplate::AddModifier("x-atest-arg=",(TemplateModifier *)&ctemplate::html_escape);
    if (cVar1 != '\0') goto LAB_00114e31;
    cVar1 = ctemplate::AddModifier("x-atest-arg=h",(TemplateModifier *)&ctemplate::html_escape);
    if (cVar1 != '\0') goto LAB_00114e36;
    cVar1 = ctemplate::AddModifier("x-atest-arg=html",(TemplateModifier *)&ctemplate::html_escape);
    if (cVar1 != '\0') goto LAB_00114e3b;
    lVar2 = ctemplate::FindModifier("x-atest",7,"",0);
    if (lVar2 == 0) goto LAB_00114e40;
    if (*(char *)(lVar2 + 0x21) == '\x01') goto LAB_00114e45;
    lVar2 = ctemplate::FindModifier("x-foo",5,"",0);
    if (lVar2 == 0) goto LAB_00114e4a;
    if (*(char *)(lVar2 + 0x22) == '\x01') goto LAB_00114e4f;
    local_10 = ctemplate::GetDefaultModifierForXml;
    cVar1 = ctemplate::AddModifier("x-foo",(TemplateModifier *)&local_10);
    if (cVar1 == '\0') goto LAB_00114e54;
    lVar2 = ctemplate::FindModifier("x-foo",5,"",0);
    if (lVar2 != 0) {
      if (*(TemplateModifier **)(lVar2 + 0x28) == (TemplateModifier *)&local_10) {
        ctemplate::TemplateModifier::~TemplateModifier((TemplateModifier *)&local_10);
        return;
      }
      goto LAB_00114e5e;
    }
  }
  Run();
LAB_00114e5e:
  Run();
  ctemplate::TemplateModifier::~TemplateModifier((TemplateModifier *)&local_10);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST(TemplateModifiers, AddModifier) {
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-atest", &GOOGLE_NAMESPACE::html_escape));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-atest-arg=", &GOOGLE_NAMESPACE::html_escape));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-atest-arg=h", &GOOGLE_NAMESPACE::html_escape));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-atest-arg=html", &GOOGLE_NAMESPACE::html_escape));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-atest-arg=json", &GOOGLE_NAMESPACE::json_escape));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-atest-arg=j", &GOOGLE_NAMESPACE::json_escape));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-atest-arg=J", &GOOGLE_NAMESPACE::json_escape));

  // Make sure AddModifier fails with an invalid name.
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddModifier("test", &GOOGLE_NAMESPACE::html_escape));

  // Make sure AddModifier fails with a duplicate name.
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddModifier("x-atest", &GOOGLE_NAMESPACE::html_escape));
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddModifier("x-atest-arg=", &GOOGLE_NAMESPACE::html_escape));
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddModifier("x-atest-arg=h", &GOOGLE_NAMESPACE::html_escape));
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddModifier("x-atest-arg=html", &GOOGLE_NAMESPACE::html_escape));

  const GOOGLE_NAMESPACE::ModifierInfo* info;
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-atest", 7, "", 0)));
  EXPECT_FALSE(info->modval_required);

  // Make sure we can still add a modifier after having already
  // searched for it.
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-foo", 5, "", 0)));
  EXPECT_FALSE(info->is_registered);

  GOOGLE_NAMESPACE::NullModifier foo_modifier;
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-foo", &foo_modifier));
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-foo", 5, "", 0)));
  EXPECT_EQ(info->modifier, &foo_modifier);
}